

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::bi_init(IZDeflate *this,char *tgt_buf,uint tgt_size,int flsh_allowed)

{
  (this->l_desc).extra_bits = this->extra_lbits;
  (this->d_desc).extra_bits = this->extra_dbits;
  (this->bl_desc).extra_bits = this->extra_blbits;
  (this->l_desc).dyn_tree = this->dyn_ltree;
  (this->d_desc).dyn_tree = this->dyn_dtree;
  (this->bl_desc).dyn_tree = this->bl_tree;
  (this->l_desc).static_tree = this->static_ltree;
  (this->d_desc).static_tree = this->static_dtree;
  (this->bl_desc).static_tree = (ct_data *)0x0;
  this->out_buf = tgt_buf;
  this->out_size = tgt_size;
  this->out_offset = 0;
  this->flush_flg = flsh_allowed;
  this->bi_buf = 0;
  this->bi_valid = 0;
  return;
}

Assistant:

void IZDeflate::bi_init (char *tgt_buf, unsigned tgt_size, int flsh_allowed)
    // char *tgt_buf;
    // unsigned tgt_size;
    // int flsh_allowed;
{
   init_desc();

    out_buf = tgt_buf;
    out_size = tgt_size;
    out_offset = 0;
    flush_flg = flsh_allowed;

    bi_buf = 0;
    bi_valid = 0;
#ifdef DEBUG
    bits_sent = (uzoff_t)0;
#endif
}